

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O1

bool __thiscall
ArmParser::parseShift(ArmParser *this,Parser *parser,ArmOpcodeVariables *vars,bool immediateOnly)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  byte bVar3;
  uchar uVar4;
  bool bVar5;
  int iVar6;
  Token *pTVar7;
  long lVar8;
  ArmParser *pAVar9;
  bool bVar10;
  bool bVar11;
  int64_t value;
  byte bVar12;
  string stringValue;
  long *local_70;
  long local_68;
  long local_60 [2];
  ArmParser *local_50;
  Expression local_48;
  
  (vars->Shift).UseShift = false;
  pTVar7 = Tokenizer::peekToken
                     ((parser->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
  if (pTVar7->type != Comma) {
    return true;
  }
  Tokenizer::eatTokens
            ((parser->entries).
             super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].tokenizer,1);
  pTVar7 = Tokenizer::nextToken
                     ((parser->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
  if (pTVar7->type != Identifier) {
    return false;
  }
  local_50 = this;
  if (*(__index_type *)
       ((long)&(pTVar7->value).
               super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
       + 0x20) != '\x04') {
    __assert_fail("std::holds_alternative<Identifier>(value)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                  ,0x4d,"const Identifier &Token::identifierValue() const");
  }
  local_70 = local_60;
  lVar8 = *(long *)&(pTVar7->value).
                    super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                    super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                    .
                    super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                    .super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                    .super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                    .
                    super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                    ._M_u;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,lVar8,
             *(long *)((long)&(pTVar7->value).
                              super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      + 8) + lVar8);
  bVar12 = *(char *)((long)local_70 + local_68 + -1) - 0x30;
  if ((bVar12 < 10) &&
     (bVar3 = *(byte *)((long)local_70 + local_68 + -1), (byte)(bVar3 - 0x30) < 10)) {
    lVar8 = 1;
    value = 0;
    do {
      value = value + ((ulong)bVar3 - 0x30) * lVar8;
      lVar8 = lVar8 * 10;
      std::__cxx11::string::pop_back();
      bVar3 = *(byte *)((long)local_70 + local_68 + -1);
    } while ((byte)(bVar3 - 0x30) < 10);
  }
  else {
    value = 0;
  }
  pAVar9 = (ArmParser *)&local_70;
  iVar6 = std::__cxx11::string::compare((char *)pAVar9);
  if (iVar6 == 0) {
    uVar4 = '\0';
LAB_00161112:
    (vars->Shift).Type = uVar4;
    if (bVar12 < 10) {
      createConstExpression(&local_48,value);
      _Var2._M_pi = local_48.expression.
                    super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
      peVar1 = local_48.expression.
               super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_48.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      local_48.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (vars->Shift).ShiftExpression.expression.
                super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      (vars->Shift).ShiftExpression.expression.
      super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
      (vars->Shift).ShiftExpression.expression.
      super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var2._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      (vars->Shift).ShiftExpression.constExpression = local_48.constExpression;
      if (local_48.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.expression.
                   super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      bVar10 = false;
    }
    else {
      bVar5 = parseRegisterTable(pAVar9,parser,&(vars->Shift).reg,armRegisters,0x13);
      pAVar9 = local_50;
      if (bVar5 && (vars->Shift).reg.num < 0x10) {
        bVar10 = true;
        if (immediateOnly) goto LAB_001611a0;
      }
      else {
        pTVar7 = Tokenizer::peekToken
                           ((parser->entries).
                            super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
        if (pTVar7->type == Hash) {
          Tokenizer::eatTokens
                    ((parser->entries).
                     super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                     _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,1);
        }
        bVar5 = parseImmediate(pAVar9,parser,&(vars->Shift).ShiftExpression);
        bVar11 = false;
        bVar10 = false;
        if (!bVar5) goto LAB_001611e6;
      }
    }
    (vars->Shift).ShiftByRegister = bVar10;
    (vars->Shift).UseShift = true;
    bVar11 = true;
  }
  else {
    pAVar9 = (ArmParser *)&local_70;
    iVar6 = std::__cxx11::string::compare((char *)pAVar9);
    if (iVar6 == 0) {
      uVar4 = '\0';
      goto LAB_00161112;
    }
    pAVar9 = (ArmParser *)&local_70;
    iVar6 = std::__cxx11::string::compare((char *)pAVar9);
    if (iVar6 == 0) {
      uVar4 = '\x01';
      goto LAB_00161112;
    }
    pAVar9 = (ArmParser *)&local_70;
    iVar6 = std::__cxx11::string::compare((char *)pAVar9);
    if (iVar6 == 0) {
      uVar4 = '\x02';
      goto LAB_00161112;
    }
    pAVar9 = (ArmParser *)&local_70;
    iVar6 = std::__cxx11::string::compare((char *)pAVar9);
    if (iVar6 == 0) {
      uVar4 = '\x03';
      goto LAB_00161112;
    }
    pAVar9 = (ArmParser *)&local_70;
    iVar6 = std::__cxx11::string::compare((char *)pAVar9);
    if (iVar6 == 0) {
      uVar4 = '\x04';
      goto LAB_00161112;
    }
LAB_001611a0:
    bVar11 = false;
  }
LAB_001611e6:
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return bVar11;
}

Assistant:

bool ArmParser::parseShift(Parser& parser, ArmOpcodeVariables& vars, bool immediateOnly)
{
	// no shift is also valid
	vars.Shift.UseShift = false;
	if (parser.peekToken().type != TokenType::Comma)
		return true;

	parser.eatToken();

	// load shift mode
	const Token& shiftMode = parser.nextToken();
	if (shiftMode.type != TokenType::Identifier)
		return false;

	std::string stringValue = shiftMode.identifierValue().string();
	
	bool hasNumber = isNumber(stringValue.back());
	int64_t number = 0;

	// handle modeXX syntax
	if (hasNumber)
	{
		int64_t multiplier = 1;
		while (isNumber(stringValue.back()))
		{
			number += multiplier*(stringValue.back() - '0');
			multiplier *= 10;
			stringValue.pop_back();
		}
	}

	if (stringValue == "lsl" || stringValue == "asl")
		vars.Shift.Type = 0;
	else if (stringValue == "lsr")
		vars.Shift.Type = 1;
	else if (stringValue == "asr")
		vars.Shift.Type = 2;
	else if (stringValue == "ror")
		vars.Shift.Type = 3;
	else if (stringValue == "rrx")
		vars.Shift.Type = 4;
	else 
		return false;

	if (hasNumber)
	{
		vars.Shift.ShiftExpression = createConstExpression(number);
		vars.Shift.ShiftByRegister = false;
	} else if (parseRegister(parser,vars.Shift.reg))
	{
		if (immediateOnly)
			return false;

		vars.Shift.ShiftByRegister = true;
	} else {
		if (parser.peekToken().type == TokenType::Hash)
			parser.eatToken();
		
		if (!parseImmediate(parser,vars.Shift.ShiftExpression))
			return false;

		vars.Shift.ShiftByRegister = false;
	}
	
	vars.Shift.UseShift = true;
	return true;
}